

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O0

void __thiscall btRaycastVehicle::updateVehicle(btRaycastVehicle *this,btScalar step)

{
  int iVar1;
  int iVar2;
  btRigidBody *pbVar3;
  btMatrix3x3 *pbVar4;
  btVector3 *pbVar5;
  btScalar *pbVar6;
  btScalar *pbVar7;
  btScalar *pbVar8;
  btWheelInfo *pbVar9;
  btRaycastVehicle *in_RDI;
  float in_XMM0_Da;
  btScalar bVar10;
  btVector3 bVar11;
  btScalar proj2;
  btScalar proj;
  btVector3 fwd;
  btTransform *chassisWorldTransform;
  btVector3 vel;
  btVector3 relpos_1;
  btWheelInfo *wheel_1;
  btVector3 relpos;
  btVector3 impulse;
  btScalar suspensionForce;
  btWheelInfo *wheel;
  int i;
  btVector3 forwardW;
  btTransform *chassisTrans;
  int i_1;
  btVector3 *in_stack_fffffffffffffee8;
  btRigidBody *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  btScalar bVar12;
  btVector3 local_c4;
  btScalar local_b4;
  undefined1 local_b0 [24];
  btVector3 local_98;
  btVector3 local_88;
  btWheelInfo *local_78;
  btScalar local_6c [4];
  btScalar local_5c;
  btWheelInfo *in_stack_ffffffffffffffa8;
  btScalar in_stack_ffffffffffffffb0;
  btScalar in_stack_ffffffffffffffb4;
  btScalar local_2c;
  btVector3 local_28;
  btTransform *local_18;
  btScalar local_10;
  float local_c;
  
  local_c = in_XMM0_Da;
  for (local_10 = 0.0; bVar10 = local_10, iVar2 = getNumWheels((btRaycastVehicle *)0x234615),
      (int)bVar10 < iVar2; local_10 = (btScalar)((int)local_10 + 1)) {
    updateWheelTransform
              ((btRaycastVehicle *)forwardW.m_floats._8_8_,(int)forwardW.m_floats[1],
               forwardW.m_floats[0]._3_1_);
  }
  pbVar3 = getRigidBody(in_RDI);
  btRigidBody::getLinearVelocity(pbVar3);
  bVar10 = btVector3::length((btVector3 *)0x23465f);
  in_RDI->m_currentVehicleSpeedKmHour = bVar10 * 3.6;
  local_18 = getChassisWorldTransform((btRaycastVehicle *)0x234680);
  pbVar4 = btTransform::getBasis(local_18);
  pbVar5 = btMatrix3x3::operator[](pbVar4,0);
  pbVar6 = btVector3::operator_cast_to_float_(pbVar5);
  iVar2 = in_RDI->m_indexForwardAxis;
  pbVar4 = btTransform::getBasis(local_18);
  pbVar5 = btMatrix3x3::operator[](pbVar4,1);
  pbVar7 = btVector3::operator_cast_to_float_(pbVar5);
  iVar1 = in_RDI->m_indexForwardAxis;
  pbVar4 = btTransform::getBasis(local_18);
  pbVar5 = btMatrix3x3::operator[](pbVar4,2);
  pbVar8 = btVector3::operator_cast_to_float_(pbVar5);
  btVector3::btVector3(&local_28,pbVar6 + iVar2,pbVar7 + iVar1,pbVar8 + in_RDI->m_indexForwardAxis);
  pbVar3 = getRigidBody(in_RDI);
  pbVar5 = btRigidBody::getLinearVelocity(pbVar3);
  bVar10 = btVector3::dot(&local_28,pbVar5);
  if (bVar10 < 0.0) {
    in_RDI->m_currentVehicleSpeedKmHour = in_RDI->m_currentVehicleSpeedKmHour * -1.0;
  }
  local_2c = 0.0;
  while (bVar10 = local_2c, iVar2 = btAlignedObjectArray<btWheelInfo>::size(&in_RDI->m_wheelInfo),
        (int)bVar10 < iVar2) {
    btAlignedObjectArray<btWheelInfo>::operator[](&in_RDI->m_wheelInfo,(int)local_2c);
    rayCast((btRaycastVehicle *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
            in_stack_ffffffffffffffa8);
    local_2c = (btScalar)((int)local_2c + 1);
  }
  updateSuspension((btRaycastVehicle *)CONCAT44(bVar10,in_stack_ffffffffffffff10),
                   (btScalar)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  local_2c = 0.0;
  while (bVar12 = local_2c, iVar2 = btAlignedObjectArray<btWheelInfo>::size(&in_RDI->m_wheelInfo),
        (int)bVar12 < iVar2) {
    pbVar9 = btAlignedObjectArray<btWheelInfo>::operator[](&in_RDI->m_wheelInfo,(int)local_2c);
    bVar11 = ::operator*((btVector3 *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8->m_floats)
    ;
    local_5c = bVar11.m_floats[0];
    ::operator*((btVector3 *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8->m_floats);
    pbVar5 = &(pbVar9->m_raycastInfo).m_contactPointWS;
    getRigidBody(in_RDI);
    btRigidBody::getCenterOfMassPosition((btRigidBody *)0x23492b);
    local_6c = (btScalar  [4])
               operator-((btVector3 *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    getRigidBody(in_RDI);
    btRigidBody::applyImpulse
              ((btRigidBody *)CONCAT44(bVar10,bVar12),pbVar5,
               (btVector3 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    local_2c = (btScalar)((int)local_2c + 1);
  }
  (*(in_RDI->super_btActionInterface)._vptr_btActionInterface[5])((ulong)(uint)local_c);
  local_2c = 0.0;
  while (bVar10 = local_2c, iVar2 = btAlignedObjectArray<btWheelInfo>::size(&in_RDI->m_wheelInfo),
        (int)bVar10 < iVar2) {
    local_78 = btAlignedObjectArray<btWheelInfo>::operator[](&in_RDI->m_wheelInfo,(int)local_2c);
    getRigidBody(in_RDI);
    btRigidBody::getCenterOfMassPosition((btRigidBody *)0x234a0e);
    local_88 = operator-((btVector3 *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    getRigidBody(in_RDI);
    local_98 = btRigidBody::getVelocityInLocalPoint
                         (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    if (((local_78->m_raycastInfo).m_isInContact & 1U) == 0) {
      local_78->m_rotation = local_78->m_deltaRotation + local_78->m_rotation;
    }
    else {
      local_b0._16_8_ = getChassisWorldTransform((btRaycastVehicle *)0x234a75);
      pbVar4 = btTransform::getBasis((btTransform *)local_b0._16_8_);
      pbVar5 = btMatrix3x3::operator[](pbVar4,0);
      pbVar6 = btVector3::operator_cast_to_float_(pbVar5);
      iVar2 = in_RDI->m_indexForwardAxis;
      pbVar4 = btTransform::getBasis((btTransform *)local_b0._16_8_);
      pbVar5 = btMatrix3x3::operator[](pbVar4,1);
      pbVar7 = btVector3::operator_cast_to_float_(pbVar5);
      in_stack_fffffffffffffee8 = (btVector3 *)(pbVar7 + in_RDI->m_indexForwardAxis);
      pbVar4 = btTransform::getBasis((btTransform *)local_b0._16_8_);
      pbVar5 = btMatrix3x3::operator[](pbVar4,2);
      pbVar7 = btVector3::operator_cast_to_float_(pbVar5);
      in_stack_fffffffffffffef0 = (btRigidBody *)local_b0;
      btVector3::btVector3
                ((btVector3 *)in_stack_fffffffffffffef0,pbVar6 + iVar2,
                 in_stack_fffffffffffffee8->m_floats,pbVar7 + in_RDI->m_indexForwardAxis);
      local_b4 = btVector3::dot((btVector3 *)in_stack_fffffffffffffef0,(btVector3 *)local_78);
      local_c4 = ::operator*((btVector3 *)in_stack_fffffffffffffef0,
                             in_stack_fffffffffffffee8->m_floats);
      btVector3::operator-=((btVector3 *)local_b0,&local_c4);
      bVar10 = btVector3::dot((btVector3 *)local_b0,&local_98);
      local_78->m_deltaRotation = (bVar10 * local_c) / local_78->m_wheelsRadius;
      local_78->m_rotation = local_78->m_deltaRotation + local_78->m_rotation;
    }
    local_78->m_deltaRotation = local_78->m_deltaRotation * 0.99;
    local_2c = (btScalar)((int)local_2c + 1);
  }
  return;
}

Assistant:

void btRaycastVehicle::updateVehicle( btScalar step )
{
	{
		for (int i=0;i<getNumWheels();i++)
		{
			updateWheelTransform(i,false);
		}
	}


	m_currentVehicleSpeedKmHour = btScalar(3.6) * getRigidBody()->getLinearVelocity().length();
	
	const btTransform& chassisTrans = getChassisWorldTransform();

	btVector3 forwardW (
		chassisTrans.getBasis()[0][m_indexForwardAxis],
		chassisTrans.getBasis()[1][m_indexForwardAxis],
		chassisTrans.getBasis()[2][m_indexForwardAxis]);

	if (forwardW.dot(getRigidBody()->getLinearVelocity()) < btScalar(0.))
	{
		m_currentVehicleSpeedKmHour *= btScalar(-1.);
	}

	//
	// simulate suspension
	//
	
	int i=0;
	for (i=0;i<m_wheelInfo.size();i++)
	{
		//btScalar depth; 
		//depth = 
		rayCast( m_wheelInfo[i]);
	}

	updateSuspension(step);

	
	for (i=0;i<m_wheelInfo.size();i++)
	{
		//apply suspension force
		btWheelInfo& wheel = m_wheelInfo[i];
		
		btScalar suspensionForce = wheel.m_wheelsSuspensionForce;
		
		if (suspensionForce > wheel.m_maxSuspensionForce)
		{
			suspensionForce = wheel.m_maxSuspensionForce;
		}
		btVector3 impulse = wheel.m_raycastInfo.m_contactNormalWS * suspensionForce * step;
		btVector3 relpos = wheel.m_raycastInfo.m_contactPointWS - getRigidBody()->getCenterOfMassPosition();
		
		getRigidBody()->applyImpulse(impulse, relpos);
	
	}
	

	
	updateFriction( step);

	
	for (i=0;i<m_wheelInfo.size();i++)
	{
		btWheelInfo& wheel = m_wheelInfo[i];
		btVector3 relpos = wheel.m_raycastInfo.m_hardPointWS - getRigidBody()->getCenterOfMassPosition();
		btVector3 vel = getRigidBody()->getVelocityInLocalPoint( relpos );

		if (wheel.m_raycastInfo.m_isInContact)
		{
			const btTransform&	chassisWorldTransform = getChassisWorldTransform();

			btVector3 fwd (
				chassisWorldTransform.getBasis()[0][m_indexForwardAxis],
				chassisWorldTransform.getBasis()[1][m_indexForwardAxis],
				chassisWorldTransform.getBasis()[2][m_indexForwardAxis]);

			btScalar proj = fwd.dot(wheel.m_raycastInfo.m_contactNormalWS);
			fwd -= wheel.m_raycastInfo.m_contactNormalWS * proj;

			btScalar proj2 = fwd.dot(vel);
			
			wheel.m_deltaRotation = (proj2 * step) / (wheel.m_wheelsRadius);
			wheel.m_rotation += wheel.m_deltaRotation;

		} else
		{
			wheel.m_rotation += wheel.m_deltaRotation;
		}
		
		wheel.m_deltaRotation *= btScalar(0.99);//damping of rotation when not in contact

	}



}